

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

void QtPrivate::QDebugStreamOperatorForType<QJsonObject,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QDebug *in_RSI;
  long in_FS_OFFSET;
  QDebug *unaff_retaddr;
  QDebug local_18 [2];
  QJsonObject *o;
  
  o = *(QJsonObject **)(in_FS_OFFSET + 0x28);
  QDebug::QDebug(local_18,in_RSI);
  ::operator<<(unaff_retaddr,o);
  QDebug::~QDebug((QDebug *)o);
  QDebug::~QDebug((QDebug *)o);
  if (*(QJsonObject **)(in_FS_OFFSET + 0x28) == o) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }